

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConditionalBranchDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&,std::span<slang::parsing::Token,18446744073709551615ul>>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,
          ConditionalDirectiveExpressionSyntax *args_2,
          span<slang::parsing::Token,_18446744073709551615UL> *args_3)

{
  span<slang::parsing::Token,_18446744073709551615UL> elements;
  ConditionalBranchDirectiveSyntax *pCVar1;
  TokenList *in_RCX;
  size_t *in_R8;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  TokenList *disabledTokens;
  ConditionalDirectiveExpressionSyntax *in_stack_ffffffffffffff90;
  SyntaxKind in_stack_ffffffffffffff9c;
  ConditionalBranchDirectiveSyntax *in_stack_ffffffffffffffa0;
  Token in_stack_ffffffffffffffa8;
  
  pCVar1 = (ConditionalBranchDirectiveSyntax *)
           allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  disabledTokens = (TokenList *)in_R8[1];
  elements._M_extent._M_extent_value = *in_R8;
  elements._M_ptr = (pointer)pCVar1;
  slang::syntax::TokenList::TokenList(in_RCX,elements);
  slang::syntax::ConditionalBranchDirectiveSyntax::ConditionalBranchDirectiveSyntax
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffff90,disabledTokens);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }